

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetrepaintmanager.cpp
# Opt level: O1

void __thiscall QWidgetRepaintManager::addStaticWidget(QWidgetRepaintManager *this,QWidget *widget)

{
  long lVar1;
  long *plVar2;
  long i;
  long in_RCX;
  long lVar3;
  long in_FS_OFFSET;
  QWidget *local_18;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  if (widget == (QWidget *)0x0) goto LAB_00319aec;
  i = *(long *)(this + 0x78);
  if (i == 0) {
LAB_00319ac2:
    in_RCX = -1;
  }
  else {
    lVar3 = -8;
    do {
      lVar1 = i * -8 + lVar3;
      if (lVar1 == -8) goto LAB_00319abc;
      in_RCX = lVar3 + 8;
      plVar2 = (long *)(*(long *)(this + 0x70) + 8 + lVar3);
      lVar3 = in_RCX;
    } while ((QWidget *)*plVar2 != widget);
    in_RCX = in_RCX >> 3;
LAB_00319abc:
    if (lVar1 == -8) goto LAB_00319ac2;
  }
  if (in_RCX == -1) {
    local_18 = widget;
    QtPrivate::QPodArrayOps<QWidget*>::emplace<QWidget*&>
              ((QPodArrayOps<QWidget*> *)(this + 0x68),i,&local_18);
    QList<QWidget_*>::end((QList<QWidget_*> *)(this + 0x68));
  }
LAB_00319aec:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWidgetRepaintManager::addStaticWidget(QWidget *widget)
{
    if (!widget)
        return;

    Q_ASSERT(widget->testAttribute(Qt::WA_StaticContents));
    if (!staticWidgets.contains(widget))
        staticWidgets.append(widget);
}